

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall
icu_63::MessagePattern::parseMessage
          (MessagePattern *this,int32_t index,int32_t msgStartLength,int32_t nestingLevel,
          UMessagePatternArgType parentType,UParseError *parseError,UErrorCode *errorCode)

{
  int32_t start;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int offset;
  int32_t limitLength;
  UChar c;
  int32_t msgStart;
  UParseError *parseError_local;
  UMessagePatternArgType parentType_local;
  int32_t nestingLevel_local;
  int32_t msgStartLength_local;
  int32_t index_local;
  MessagePattern *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (nestingLevel < 0x8000) {
      start = this->partsLength;
      addPart(this,UMSGPAT_PART_TYPE_MSG_START,index,msgStartLength,nestingLevel,errorCode);
      offset = msgStartLength + index;
LAB_003f2a7b:
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                nestingLevel_local = offset;
                UVar1 = ::U_FAILURE(*errorCode);
                if (UVar1 != '\0') {
                  return 0;
                }
                iVar3 = icu_63::UnicodeString::length(&this->msg);
                if (iVar3 <= nestingLevel_local) {
                  if ((0 < nestingLevel) &&
                     (UVar1 = inTopLevelChoiceMessage(this,nestingLevel,parentType), UVar1 == '\0'))
                  {
                    setParseError(this,parseError,0);
                    *errorCode = U_UNMATCHED_BRACES;
                    return 0;
                  }
                  addLimitPart(this,start,UMSGPAT_PART_TYPE_MSG_LIMIT,nestingLevel_local,0,
                               nestingLevel,errorCode);
                  return nestingLevel_local;
                }
                offset = nestingLevel_local + 1;
                cVar2 = icu_63::UnicodeString::charAt(&this->msg,nestingLevel_local);
                if (cVar2 == L'\'') break;
                if (((parentType == UMSGPAT_ARG_TYPE_PLURAL) ||
                    (parentType == UMSGPAT_ARG_TYPE_SELECTORDINAL)) && (cVar2 == L'#')) {
                  addPart(this,UMSGPAT_PART_TYPE_REPLACE_NUMBER,nestingLevel_local,1,0,errorCode);
                }
                else if (cVar2 == L'{') {
                  offset = parseArg(this,nestingLevel_local,1,nestingLevel,parseError,errorCode);
                }
                else if (((0 < nestingLevel) && (cVar2 == L'}')) ||
                        ((parentType == UMSGPAT_ARG_TYPE_CHOICE && (cVar2 == L'|')))) {
                  addLimitPart(this,start,UMSGPAT_PART_TYPE_MSG_LIMIT,nestingLevel_local,
                               (uint)(parentType != UMSGPAT_ARG_TYPE_CHOICE || cVar2 != L'}'),
                               nestingLevel,errorCode);
                  if (parentType == UMSGPAT_ARG_TYPE_CHOICE) {
                    return nestingLevel_local;
                  }
                  return offset;
                }
              }
              iVar3 = icu_63::UnicodeString::length(&this->msg);
              if (offset != iVar3) break;
              addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,offset,0,0x27,errorCode);
              this->needsAutoQuoting = '\x01';
            }
            cVar2 = icu_63::UnicodeString::charAt(&this->msg,offset);
            if (cVar2 != L'\'') break;
            addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,offset,1,0,errorCode);
            offset = nestingLevel_local + 2;
          }
          if (((((this->aposMode == UMSGPAT_APOS_DOUBLE_REQUIRED) || (cVar2 == L'{')) ||
               (cVar2 == L'}')) || ((parentType == UMSGPAT_ARG_TYPE_CHOICE && (cVar2 == L'|')))) ||
             (((parentType == UMSGPAT_ARG_TYPE_PLURAL ||
               (parentType == UMSGPAT_ARG_TYPE_SELECTORDINAL)) && (cVar2 == L'#')))) break;
          addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,offset,0,0x27,errorCode);
          this->needsAutoQuoting = '\x01';
        }
        addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,nestingLevel_local,1,0,errorCode);
        nestingLevel_local = offset;
        while (iVar3 = icu_63::UnicodeString::indexOf(&this->msg,L'\'',nestingLevel_local + 1),
              -1 < iVar3) {
          cVar2 = icu_63::UnicodeString::charAt(&this->msg,iVar3 + 1);
          if (cVar2 != L'\'') {
            addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,iVar3,1,0,errorCode);
            offset = iVar3 + 1;
            goto LAB_003f2a7b;
          }
          nestingLevel_local = iVar3 + 1;
          addPart(this,UMSGPAT_PART_TYPE_SKIP_SYNTAX,nestingLevel_local,1,0,errorCode);
        }
        offset = icu_63::UnicodeString::length(&this->msg);
        addPart(this,UMSGPAT_PART_TYPE_INSERT_CHAR,offset,0,0x27,errorCode);
        this->needsAutoQuoting = '\x01';
      } while( true );
    }
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseMessage(int32_t index, int32_t msgStartLength,
                             int32_t nestingLevel, UMessagePatternArgType parentType,
                             UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(nestingLevel>Part::MAX_VALUE) {
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    int32_t msgStart=partsLength;
    addPart(UMSGPAT_PART_TYPE_MSG_START, index, msgStartLength, nestingLevel, errorCode);
    index+=msgStartLength;
    for(;;) {  // while(index<msg.length()) with U_FAILURE(errorCode) check
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        if(index>=msg.length()) {
            break;
        }
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            if(index==msg.length()) {
                // The apostrophe is the last character in the pattern. 
                // Add a Part for auto-quoting.
                addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                        u_apos, errorCode);  // value=char to be inserted
                needsAutoQuoting=TRUE;
            } else {
                c=msg.charAt(index);
                if(c==u_apos) {
                    // double apostrophe, skip the second one
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                } else if(
                    aposMode==UMSGPAT_APOS_DOUBLE_REQUIRED ||
                    c==u_leftCurlyBrace || c==u_rightCurlyBrace ||
                    (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe) ||
                    (UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound)
                ) {
                    // skip the quote-starting apostrophe
                    addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index-1, 1, 0, errorCode);
                    // find the end of the quoted literal text
                    for(;;) {
                        index=msg.indexOf(u_apos, index+1);
                        if(index>=0) {
                            if(/*(index+1)<msg.length() &&*/ msg.charAt(index+1)==u_apos) {
                                // double apostrophe inside quoted literal text
                                // still encodes a single apostrophe, skip the second one
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, ++index, 1, 0, errorCode);
                            } else {
                                // skip the quote-ending apostrophe
                                addPart(UMSGPAT_PART_TYPE_SKIP_SYNTAX, index++, 1, 0, errorCode);
                                break;
                            }
                        } else {
                            // The quoted text reaches to the end of the of the message.
                            index=msg.length();
                            // Add a Part for auto-quoting.
                            addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                                    u_apos, errorCode);  // value=char to be inserted
                            needsAutoQuoting=TRUE;
                            break;
                        }
                    }
                } else {
                    // Interpret the apostrophe as literal text.
                    // Add a Part for auto-quoting.
                    addPart(UMSGPAT_PART_TYPE_INSERT_CHAR, index, 0,
                            u_apos, errorCode);  // value=char to be inserted
                    needsAutoQuoting=TRUE;
                }
            }
        } else if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(parentType) && c==u_pound) {
            // The unquoted # in a plural message fragment will be replaced
            // with the (number-offset).
            addPart(UMSGPAT_PART_TYPE_REPLACE_NUMBER, index-1, 1, 0, errorCode);
        } else if(c==u_leftCurlyBrace) {
            index=parseArg(index-1, 1, nestingLevel, parseError, errorCode);
        } else if((nestingLevel>0 && c==u_rightCurlyBrace) ||
                  (parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_pipe)) {
            // Finish the message before the terminator.
            // In a choice style, report the "}" substring only for the following ARG_LIMIT,
            // not for this MSG_LIMIT.
            int32_t limitLength=(parentType==UMSGPAT_ARG_TYPE_CHOICE && c==u_rightCurlyBrace) ? 0 : 1;
            addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index-1, limitLength,
                         nestingLevel, errorCode);
            if(parentType==UMSGPAT_ARG_TYPE_CHOICE) {
                // Let the choice style parser see the '}' or '|'.
                return index-1;
            } else {
                // continue parsing after the '}'
                return index;
            }
        }  // else: c is part of literal text
    }
    if(nestingLevel>0 && !inTopLevelChoiceMessage(nestingLevel, parentType)) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    addLimitPart(msgStart, UMSGPAT_PART_TYPE_MSG_LIMIT, index, 0, nestingLevel, errorCode);
    return index;
}